

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<int>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  DataChunk *pDVar1;
  unsigned_long *puVar2;
  CURSOR_TYPE *pCVar3;
  HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
  *this_00;
  CursorType *pCVar4;
  reference pvVar5;
  ulong uVar6;
  ValidityMask *pVVar7;
  pair<unsigned_long,_int> local_40;
  
  if (begin < end) {
    do {
      puVar2 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pCVar3 = this->included->dmask;
        uVar6 = (pCVar3->scan).current_row_index;
        if (begin < uVar6 || (pCVar3->scan).next_row_index <= begin) {
          pDVar1 = &pCVar3->page;
          ColumnDataCollection::Seek(pCVar3->inputs,begin,&pCVar3->scan,pDVar1);
          pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
          pCVar3->data = (int *)pvVar5->data;
          pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
          FlatVector::VerifyFlatVector(pvVar5);
          pVVar7 = &pvVar5->validity;
          pCVar3->validity = pVVar7;
          uVar6 = (pCVar3->scan).current_row_index;
        }
        else {
          pVVar7 = pCVar3->validity;
        }
        puVar2 = (pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) ||
           ((puVar2[begin - uVar6 >> 6 & 0x3ffffff] >> (begin - uVar6 & 0x3f) & 1) != 0)) {
          this_00 = this->skip;
          pCVar4 = this->data;
          uVar6 = (pCVar4->scan).current_row_index;
          if ((pCVar4->scan).next_row_index <= begin || begin < uVar6) {
            pDVar1 = &pCVar4->page;
            ColumnDataCollection::Seek(pCVar4->inputs,begin,&pCVar4->scan,pDVar1);
            pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
            pCVar4->data = (int *)pvVar5->data;
            pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
            FlatVector::VerifyFlatVector(pvVar5);
            pCVar4->validity = &pvVar5->validity;
            uVar6 = (pCVar4->scan).current_row_index;
          }
          local_40.second = pCVar4->data[(uint)((int)begin - (int)uVar6)];
          local_40.first = begin;
          duckdb_skiplistlib::skip_list::
          HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
          ::insert(this_00,&local_40);
        }
      }
      begin = begin + 1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}